

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::ParsedIR::set_name(ParsedIR *this,ID id,string *name)

{
  bool bVar1;
  value_type *__x;
  undefined1 local_2c [12];
  mapped_type *m;
  string *name_local;
  ParsedIR *this_local;
  ID id_local;
  
  m = (mapped_type *)name;
  name_local = (string *)this;
  this_local._4_4_ = id.id;
  local_2c._4_8_ =
       ::std::
       unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
       ::operator[](&this->meta,(key_type *)((long)&this_local + 4));
  ::std::__cxx11::string::operator=((string *)local_2c._4_8_,(string *)m);
  bVar1 = is_valid_identifier((string *)m);
  if ((!bVar1) || (bVar1 = is_reserved_identifier((string *)m,false,false), bVar1)) {
    local_2c._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
             &this->meta_needing_name_fixup,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_2c,__x);
  }
  return;
}

Assistant:

void ParsedIR::set_name(ID id, const string &name)
{
	auto &m = meta[id];
	m.decoration.alias = name;
	if (!is_valid_identifier(name) || is_reserved_identifier(name, false, false))
		meta_needing_name_fixup.insert(id);
}